

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::releaseFboAttachmentReference(ReferenceContext *this,Attachment *attachment)

{
  _Rb_tree_color _Var1;
  TestError *this_00;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  
  if (attachment->type == ATTACHMENTTYPE_RENDERBUFFER) {
    _Var1 = attachment->name;
    if (_Var1 == _S_red) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"attachment.name != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x7a5);
    }
    else {
      p_Var3 = (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      if (p_Var3 != (_Base_ptr)0x0) {
        p_Var4 = &(this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = &p_Var4->_M_header;
        do {
          bVar5 = p_Var3[1]._M_color < _Var1;
          if (!bVar5) {
            p_Var2 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[bVar5];
        } while (p_Var3 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var2 != p_Var4) && (p_Var2[1]._M_color <= _Var1)) &&
           ((Renderbuffer *)p_Var2[1]._M_parent != (Renderbuffer *)0x0)) {
          rc::ObjectManager<sglr::rc::Renderbuffer>::releaseReference
                    (&this->m_renderbuffers,(Renderbuffer *)p_Var2[1]._M_parent);
          return;
        }
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"rbo",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x7a7);
    }
  }
  else {
    if (attachment->type != ATTACHMENTTYPE_TEXTURE) {
      return;
    }
    _Var1 = attachment->name;
    if (_Var1 == _S_red) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"attachment.name != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x79c);
    }
    else {
      p_Var3 = (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var3 != (_Base_ptr)0x0) {
        p_Var4 = &(this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = &p_Var4->_M_header;
        do {
          bVar5 = p_Var3[1]._M_color < _Var1;
          if (!bVar5) {
            p_Var2 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[bVar5];
        } while (p_Var3 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var2 != p_Var4) && (p_Var2[1]._M_color <= _Var1)) &&
           ((Texture *)p_Var2[1]._M_parent != (Texture *)0x0)) {
          rc::ObjectManager<sglr::rc::Texture>::releaseReference
                    (&this->m_textures,(Texture *)p_Var2[1]._M_parent);
          return;
        }
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"texture",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x79e);
    }
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ReferenceContext::releaseFboAttachmentReference (const Framebuffer::Attachment& attachment)
{
	switch (attachment.type)
	{
		case Framebuffer::ATTACHMENTTYPE_TEXTURE:
		{
			TCU_CHECK(attachment.name != 0);
			Texture* texture = m_textures.find(attachment.name);
			TCU_CHECK(texture);
			m_textures.releaseReference(texture);
			break;
		}

		case Framebuffer::ATTACHMENTTYPE_RENDERBUFFER:
		{
			TCU_CHECK(attachment.name != 0);
			Renderbuffer* rbo = m_renderbuffers.find(attachment.name);
			TCU_CHECK(rbo);
			m_renderbuffers.releaseReference(rbo);
			break;
		}

		default:
			break; // Silently ignore
	}
}